

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::process_client_socket<std::function<bool(httplib::Stream&)>>
               (socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
               time_t write_timeout_sec,time_t write_timeout_usec,
               function<bool_(httplib::Stream_&)> *callback)

{
  bool bVar1;
  undefined1 local_68 [8];
  SocketStream strm;
  function<bool_(httplib::Stream_&)> *callback_local;
  time_t write_timeout_usec_local;
  time_t write_timeout_sec_local;
  time_t read_timeout_usec_local;
  time_t read_timeout_sec_local;
  socket_t sock_local;
  
  strm.write_timeout_usec_ = (time_t)callback;
  SocketStream::SocketStream
            ((SocketStream *)local_68,sock,read_timeout_sec,read_timeout_usec,write_timeout_sec,
             write_timeout_usec);
  bVar1 = std::function<bool_(httplib::Stream_&)>::operator()(callback,(Stream *)local_68);
  SocketStream::~SocketStream((SocketStream *)local_68);
  return bVar1;
}

Assistant:

inline bool process_client_socket(socket_t sock, time_t read_timeout_sec,
										  time_t read_timeout_usec,
										  time_t write_timeout_sec,
										  time_t write_timeout_usec, T callback) {
			SocketStream strm(sock, read_timeout_sec, read_timeout_usec,
							  write_timeout_sec, write_timeout_usec);
			return callback(strm);
		}